

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::MinMaxNBind<duckdb::GreaterThan>
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  PhysicalType PVar1;
  pointer puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  pointer pEVar5;
  reference pvVar6;
  code *pcVar7;
  ParameterNotResolvedException *this_01;
  code *pcVar8;
  code *pcVar9;
  code *pcVar10;
  code *pcVar11;
  code *pcVar12;
  pointer this_02;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  LogicalType local_50;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  puVar2 = (arguments->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_02 = (arguments->
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_02 != puVar2; this_02 = this_02 + 1
      ) {
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_02);
    if ((pEVar5->return_type).id_ == UNKNOWN) {
      this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
      ParameterNotResolvedException::ParameterNotResolvedException(this_01);
      __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
  }
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar6);
  PVar1 = (pEVar5->return_type).physical_type_;
  switch(PVar1) {
  case INT32:
    pcVar7 = MinMaxNUpdate<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>;
    pcVar8 = MinMaxNOperation::
             Finalize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>;
    pcVar9 = AggregateFunction::
             StateDestroy<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
    ;
    pcVar10 = AggregateFunction::
              StateCombine<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
    ;
    pcVar11 = AggregateFunction::
              StateInitialize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
    ;
    pcVar12 = AggregateFunction::
              StateSize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>;
    break;
  case INT64:
    pcVar7 = MinMaxNUpdate<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>>
    ;
    pcVar8 = MinMaxNOperation::
             Finalize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>>;
    pcVar9 = AggregateFunction::
             StateDestroy<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
    ;
    pcVar10 = AggregateFunction::
              StateCombine<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
    ;
    pcVar11 = AggregateFunction::
              StateInitialize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
    ;
    pcVar12 = AggregateFunction::
              StateSize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::GreaterThan>>;
    break;
  case FLOAT:
    pcVar7 = 
    MinMaxNUpdate<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>>;
    pcVar8 = MinMaxNOperation::
             Finalize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>>;
    pcVar9 = AggregateFunction::
             StateDestroy<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
    ;
    pcVar10 = AggregateFunction::
              StateCombine<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
    ;
    pcVar11 = AggregateFunction::
              StateInitialize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
    ;
    pcVar12 = AggregateFunction::
              StateSize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::GreaterThan>>;
    break;
  case DOUBLE:
    pcVar7 = 
    MinMaxNUpdate<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>>;
    pcVar8 = MinMaxNOperation::
             Finalize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>>;
    pcVar9 = AggregateFunction::
             StateDestroy<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
    ;
    pcVar10 = AggregateFunction::
              StateCombine<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
    ;
    pcVar11 = AggregateFunction::
              StateInitialize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
    ;
    pcVar12 = AggregateFunction::
              StateSize<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::GreaterThan>>;
    break;
  default:
    if (PVar1 == VARCHAR) {
      pcVar7 = MinMaxNUpdate<duckdb::MinMaxNState<duckdb::MinMaxStringValue,duckdb::GreaterThan>>;
      pcVar8 = MinMaxNOperation::
               Finalize<duckdb::MinMaxNState<duckdb::MinMaxStringValue,duckdb::GreaterThan>>;
      pcVar9 = AggregateFunction::
               StateDestroy<duckdb::MinMaxNState<duckdb::MinMaxStringValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar10 = AggregateFunction::
                StateCombine<duckdb::MinMaxNState<duckdb::MinMaxStringValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
      ;
      pcVar11 = AggregateFunction::
                StateInitialize<duckdb::MinMaxNState<duckdb::MinMaxStringValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
      ;
      pcVar12 = AggregateFunction::
                StateSize<duckdb::MinMaxNState<duckdb::MinMaxStringValue,duckdb::GreaterThan>>;
      break;
    }
  case UINT64:
  case UINT64|UINT8:
    pcVar7 = MinMaxNUpdate<duckdb::MinMaxNState<duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>;
    pcVar8 = MinMaxNOperation::
             Finalize<duckdb::MinMaxNState<duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>;
    pcVar9 = AggregateFunction::
             StateDestroy<duckdb::MinMaxNState<duckdb::MinMaxFallbackValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
    ;
    pcVar10 = AggregateFunction::
              StateCombine<duckdb::MinMaxNState<duckdb::MinMaxFallbackValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
    ;
    pcVar11 = AggregateFunction::
              StateInitialize<duckdb::MinMaxNState<duckdb::MinMaxFallbackValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
    ;
    pcVar12 = AggregateFunction::
              StateSize<duckdb::MinMaxNState<duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>;
  }
  function->state_size = pcVar12;
  function->initialize = pcVar11;
  function->combine = pcVar10;
  function->destructor = pcVar9;
  function->finalize = pcVar8;
  function->update = pcVar7;
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar6);
  LogicalType::LIST(&local_50,&pEVar5->return_type);
  _Var4._M_pi = local_50.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  peVar3 = local_50.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (function->super_BaseScalarFunction).return_type.id_ = local_50.id_;
  (function->super_BaseScalarFunction).return_type.physical_type_ = local_50.physical_type_;
  uVar13 = *(undefined4 *)
            &(function->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar14 = *(undefined4 *)
            ((long)&(function->super_BaseScalarFunction).return_type.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
            );
  uVar15 = *(undefined4 *)
            &(function->super_BaseScalarFunction).return_type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  uVar16 = *(undefined4 *)
            ((long)&(function->super_BaseScalarFunction).return_type.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 4);
  (function->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (function->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_50.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_50.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (function->super_BaseScalarFunction).return_type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (function->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  (function->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_38 = uVar13;
    uStack_34 = uVar14;
    uStack_30 = uVar15;
    uStack_2c = uVar16;
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    uVar13 = local_38;
    uVar14 = uStack_34;
    uVar15 = uStack_30;
    uVar16 = uStack_2c;
  }
  _Var4._M_pi = local_50.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_50.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)CONCAT44(uVar14,uVar13);
  local_50.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = uVar16;
  local_50.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = uVar15;
  if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
  }
  LogicalType::~LogicalType(&local_50);
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> MinMaxNBind(ClientContext &context, AggregateFunction &function,
                                     vector<unique_ptr<Expression>> &arguments) {

	for (auto &arg : arguments) {
		if (arg->return_type.id() == LogicalTypeId::UNKNOWN) {
			throw ParameterNotResolvedException();
		}
	}

	const auto val_type = arguments[0]->return_type.InternalType();

	// Specialize the function based on the input types
	SpecializeMinMaxNFunction<COMPARATOR>(val_type, function);

	function.return_type = LogicalType::LIST(arguments[0]->return_type);
	return nullptr;
}